

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

uint32_t gen_prep_dbgex(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t0;
  target_ulong dbsr;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  if ((ctx->flags & 0x100) == 0) {
    ctx_local._4_4_ = 0x44;
  }
  else {
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    if ((ctx->singlestep_enabled & 1U) == 0) {
      t0 = (TCGv_i64)0x4000000;
    }
    else {
      t0 = (TCGv_i64)0x8000000;
    }
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_spr(tcg_ctx_00,t,0x130);
    tcg_gen_ori_i64_ppc64(tcg_ctx_00,t,t,(int64_t)t0);
    gen_store_spr(tcg_ctx_00,0x130,t);
    tcg_temp_free_i64(tcg_ctx_00,t);
    ctx_local._4_4_ = 0xf;
  }
  return ctx_local._4_4_;
}

Assistant:

static uint32_t gen_prep_dbgex(DisasContext *ctx)
{
    if (ctx->flags & POWERPC_FLAG_DE) {
        TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
        target_ulong dbsr = 0;
        if (ctx->singlestep_enabled & CPU_SINGLE_STEP) {
            dbsr = DBCR0_ICMP;
        } else {
            /* Must have been branch */
            dbsr = DBCR0_BRT;
        }
        TCGv t0 = tcg_temp_new(tcg_ctx);
        gen_load_spr(tcg_ctx, t0, SPR_BOOKE_DBSR);
        tcg_gen_ori_tl(tcg_ctx, t0, t0, dbsr);
        gen_store_spr(tcg_ctx, SPR_BOOKE_DBSR, t0);
        tcg_temp_free(tcg_ctx, t0);
        return POWERPC_EXCP_DEBUG;
    } else {
        return POWERPC_EXCP_TRACE;
    }
}